

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O3

err_t cmdFileSuffixRead(octet *suffix,size_t *count,char *name,size_t offset)

{
  bool_t bVar1;
  file_t file;
  size_t sVar2;
  octet *der;
  size_t sVar3;
  size_t sVar4;
  err_t eVar5;
  ulong uVar6;
  size_t len;
  u32 tag;
  size_t local_40;
  u32 local_34;
  
  file = fileOpen(name,"rb");
  if (file == (file_t)0x0) {
    return 0xcb;
  }
  sVar2 = fileSize(file);
  if (sVar2 == 0xffffffffffffffff) {
    eVar5 = 0xcf;
  }
  else {
    eVar5 = 0xd1;
    uVar6 = sVar2 - offset;
    if (offset <= sVar2 && uVar6 != 0) {
      der = (octet *)blobCreate(0x10);
      if (der != (octet *)0x0) {
        sVar4 = 0x10;
        if (uVar6 < 0x10) {
          sVar4 = uVar6;
        }
        bVar1 = fileSeek(file,uVar6 - sVar4,0);
        if ((bVar1 == 0) || (sVar3 = fileRead2(der,sVar4,file), sVar3 != sVar4)) {
LAB_0010497e:
          blobClose(der);
          fileClose(file);
          return 0xcf;
        }
        memRev(der,sVar4);
        sVar4 = derTLDec(&local_34,&local_40,der,sVar4);
        if ((sVar4 == 0xffffffffffffffff) || (sVar2 < offset + sVar4 + local_40)) {
          blobClose(der);
          fileClose(file);
        }
        else {
          sVar4 = local_40 + sVar4;
          blobClose(der);
          der = (octet *)blobCreate(sVar4);
          if (der == (octet *)0x0) goto LAB_00104a3a;
          bVar1 = fileSeek(file,uVar6 - sVar4,0);
          if ((bVar1 == 0) || (sVar2 = fileRead2(der,sVar4,file), sVar2 != sVar4))
          goto LAB_0010497e;
          bVar1 = fileClose(file);
          if (bVar1 == 0) {
            blobClose(der);
            return 0x67;
          }
          memRev(der,sVar4);
          bVar1 = derIsValid3(der,sVar4);
          if (bVar1 != 0) {
            memRev(der,sVar4);
            eVar5 = 0;
            if ((suffix != (octet *)0x0) && (eVar5 = 0x6e, sVar4 <= *count)) {
              memCopy(suffix,der,sVar4);
              eVar5 = 0;
            }
            *count = sVar4;
            blobClose(der);
            return eVar5;
          }
          blobClose(der);
        }
        return 0x132;
      }
LAB_00104a3a:
      fileClose(file);
      return 0x6e;
    }
  }
  fileClose(file);
  return eVar5;
}

Assistant:

err_t cmdFileSuffixRead(octet* suffix, size_t* count, const char* name,
	size_t offset)
{
	const size_t buf_size = 16;
	err_t code;
	file_t file;
	size_t size;
	void* buf;
	size_t c;
	u32 tag;
	size_t len;
	// pre
	ASSERT(strIsValid(name));
	ASSERT(memIsValid(count, O_PER_S));
	// открыть файл
	code = cmdFileOpen(file, name, "rb");
	ERR_CALL_CHECK(code);
	// определить размер файла
	if ((size = fileSize(file)) == SIZE_MAX)
		code = ERR_FILE_READ;
	else if (offset >= size)
		code = ERR_FILE_SIZE;
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// подготовить память
	code = cmdBlobCreate(buf, buf_size);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// прочитать заголовок суффикса
	c = MIN2(buf_size, size - offset);
	if (!fileSeek(file, size - offset - c, SEEK_SET) ||
		fileRead2(buf, c, file) != c)
		code = ERR_FILE_READ;
	ERR_CALL_HANDLE(code, (cmdBlobClose(buf), cmdFileClose(file)));
	// развернуть суффикс
	memRev(buf, c);
	// определить длину суффикса
	c = derTLDec(&tag, &len, buf, c);
	if (c == SIZE_MAX || offset + c + len > size)
		code = ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, (cmdBlobClose(buf), cmdFileClose(file)));
	c += len;
	// прочитать суффикс
	cmdBlobClose(buf);
	code = cmdBlobCreate(buf, c);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	if (!fileSeek(file, size - offset - c, SEEK_SET) ||
		fileRead2(buf, c, file) != c)
		code = ERR_FILE_READ;
	ERR_CALL_HANDLE(code, (cmdBlobClose(buf), cmdFileClose(file)));
	// закрыть файл
	code = cmdFileClose(file);
	ERR_CALL_HANDLE(code, cmdBlobClose(buf));
	// проверить суффикс
	memRev(buf, c);
	if (!derIsValid3(buf, c))
		code = ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, cmdBlobClose(buf));
	memRev(buf, c);
	// возвратить суффикс и его длину
	if (suffix)
	{
		ASSERT(memIsValid(suffix, *count));
		if (*count < c)
			code = ERR_OUTOFMEMORY;
		else
			memCopy(suffix, buf, c);
	}
	*count = c;
	// завершить
	cmdBlobClose(buf);
	return code;
}